

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

Int64Parameter * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors
          (KNearestNeighborsClassifier *this)

{
  Int64Parameter *this_00;
  
  this_00 = this->numberofneighbors_;
  if (this_00 == (Int64Parameter *)0x0) {
    this_00 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_00);
    this->numberofneighbors_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Int64Parameter* KNearestNeighborsClassifier::mutable_numberofneighbors() {
  
  if (numberofneighbors_ == NULL) {
    numberofneighbors_ = new ::CoreML::Specification::Int64Parameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.numberOfNeighbors)
  return numberofneighbors_;
}